

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

bool __thiscall QWizardPrivate::ensureButton(QWizardPrivate *this,WizardButton which)

{
  QWidget *this_00;
  undefined1 uVar1;
  QWidget *this_01;
  QStyle *style;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  
  if (((uint)which < 9) && (*(long *)((long)&this->field_20 + (ulong)(uint)which * 8) == 0)) {
    this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    this_01 = (QWidget *)operator_new(0x28);
    QPushButton::QPushButton((QPushButton *)this_01,&this->antiFlickerWidget->super_QWidget);
    style = QWidget::style(this_00);
    pQVar2 = QApplication::style();
    if (style != pQVar2) {
      QWidget::setStyle(this_01,style);
    }
    uVar1 = (*(code *)(&DAT_006f7a10 + *(int *)(&DAT_006f7a10 + (ulong)(uint)which * 4)))();
    return (bool)uVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (uint)which < 9;
  }
  __stack_chk_fail();
}

Assistant:

bool QWizardPrivate::ensureButton(QWizard::WizardButton which) const
{
    Q_Q(const QWizard);
    if (uint(which) >= QWizard::NButtons)
        return false;

    if (!btns[which]) {
        QPushButton *pushButton = new QPushButton(antiFlickerWidget);
        QStyle *style = q->style();
        if (style != QApplication::style()) // Propagate style
            pushButton->setStyle(style);
        pushButton->setObjectName(object_name_for_button(which));
#ifdef Q_OS_MACOS
        pushButton->setAutoDefault(false);
#endif
        pushButton->hide();
#ifdef Q_CC_HPACC
        const_cast<QWizardPrivate *>(this)->btns[which] = pushButton;
#else
        btns[which] = pushButton;
#endif
        if (which < QWizard::NStandardButtons)
            pushButton->setText(buttonDefaultText(wizStyle, which, this));

        connectButton(which);
    }
    return true;
}